

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O2

string * __thiscall jbcoin::STTx::getFullText_abi_cxx11_(string *__return_storage_ptr__,STTx *this)

{
  base_uint<256UL,_void> *a;
  string sStack_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"\"",(allocator *)&sStack_58);
  local_38 = *(undefined8 *)(this->tid_).pn;
  uStack_30 = *(undefined8 *)((this->tid_).pn + 2);
  local_28 = *(undefined8 *)((this->tid_).pn + 4);
  uStack_20 = *(undefined8 *)((this->tid_).pn + 6);
  to_string<256ul,void>(&sStack_58,(jbcoin *)&local_38,a);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  STObject::getFullText_abi_cxx11_(&sStack_58,&this->super_STObject);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string
STTx::getFullText () const
{
    std::string ret = "\"";
    ret += to_string (getTransactionID ());
    ret += "\" = {";
    ret += STObject::getFullText ();
    ret += "}";
    return ret;
}